

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O1

void __thiscall CS248::OSDText::render(OSDText *this)

{
  pointer pcVar1;
  pointer pOVar2;
  undefined1 local_78 [16];
  _Alloc_hider local_68;
  char local_58 [16];
  size_t local_48;
  Color CStack_40;
  
  (*__glewUseProgram)(this->program);
  glEnable(0xbe2);
  glBlendFunc(0x302,0x303);
  pOVar2 = (this->lines).super__Vector_base<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pOVar2 != (this->lines).super__Vector_base<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_78._8_4_ = pOVar2->y;
      local_78._0_4_ = pOVar2->id;
      local_78._4_4_ = pOVar2->x;
      pcVar1 = (pOVar2->text)._M_dataplus._M_p;
      local_68._M_p = local_58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar1,pcVar1 + (pOVar2->text)._M_string_length);
      CStack_40.b = (pOVar2->color).b;
      CStack_40.a = (pOVar2->color).a;
      local_48 = pOVar2->size;
      CStack_40.r = (pOVar2->color).r;
      CStack_40.g = (pOVar2->color).g;
      draw_line(this,(OSDLine *)local_78);
      if (local_68._M_p != local_58) {
        operator_delete(local_68._M_p);
      }
      pOVar2 = pOVar2 + 1;
    } while (pOVar2 != (this->lines).
                       super__Vector_base<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  (*__glewUseProgram)(0);
  return;
}

Assistant:

void OSDText::render() {

  glUseProgram(program);

  glEnable( GL_BLEND );
  glBlendFunc( GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA );

  vector<OSDLine>::iterator it = lines.begin();
  while(it != lines.end()) {
    draw_line(*it);
    ++it;
  }

  glUseProgram(0);
}